

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

EnumValueOptions * __thiscall
google::protobuf::EnumValueDescriptorProto::mutable_options(EnumValueDescriptorProto *this)

{
  EnumValueOptions *this_00;
  EnumValueDescriptorProto *this_local;
  
  set_has_options(this);
  if (this->options_ == (EnumValueOptions *)0x0) {
    this_00 = (EnumValueOptions *)operator_new(0x70);
    EnumValueOptions::EnumValueOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::EnumValueOptions* EnumValueDescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) {
    options_ = new ::google::protobuf::EnumValueOptions;
  }
  // @@protoc_insertion_point(field_mutable:google.protobuf.EnumValueDescriptorProto.options)
  return options_;
}